

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O2

void __thiscall duckdb::CSVFileHandle::Seek(CSVFileHandle *this,idx_t position)

{
  bool bVar1;
  pointer this_00;
  InternalException *this_01;
  allocator local_39;
  string local_38;
  
  if (this->can_seek != false) {
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(&this->file_handle);
    FileHandle::Seek(this_00,position);
    return;
  }
  bVar1 = this->is_pipe;
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  if (bVar1 == true) {
    ::std::__cxx11::string::string((string *)&local_38,"Trying to seek a piped CSV File.",&local_39)
    ;
    InternalException::InternalException(this_01,&local_38);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string
            ((string *)&local_38,"Trying to seek a compressed CSV File.",&local_39);
  InternalException::InternalException(this_01,&local_38);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVFileHandle::Seek(const idx_t position) const {
	if (!can_seek) {
		if (is_pipe) {
			throw InternalException("Trying to seek a piped CSV File.");
		}
		throw InternalException("Trying to seek a compressed CSV File.");
	}
	file_handle->Seek(position);
}